

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O1

void __thiscall
MacProj::mac_sync_compute
          (MacProj *this,int level,Array<MultiFab_*,_3> *Ucorr,MultiFab *u_mac,MultiFab *Vsync,
          MultiFab *Ssync,FluxRegister *adv_flux_reg,
          Vector<AdvectionForm,_std::allocator<AdvectionForm>_> *advectionType,Real prev_time,
          Real dt,int num_state_comps,Real be_cn_theta,int do_mom_diff,bool update_fluxreg)

{
  BoxArray *bxs;
  Geometry *geom;
  int iVar1;
  int iVar2;
  int iVar3;
  AmrLevel *pAVar4;
  pointer pGVar5;
  unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> this_00;
  FArrayBox *pFVar6;
  double *pdVar7;
  double *pdVar8;
  MultiFab *vcorr;
  MultiFab *wcorr;
  pointer pBVar9;
  MultiFab *pMVar10;
  MultiFab *pMVar11;
  double dVar12;
  string redistribution_type;
  string redistribution_type_00;
  uint aofs_comp;
  MultiFab *aofs;
  undefined8 uVar13;
  undefined8 uVar14;
  unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  BoxArray *pBVar20;
  MultiFab *pMVar21;
  long lVar22;
  long lVar23;
  MultiFab *yfluxes;
  DeviceVector<amrex::BCRec> *pDVar24;
  DeviceVector<amrex::BCRec> *pDVar25;
  int *piVar26;
  int *piVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  int *piVar33;
  MultiFab *wmac;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  MultiFab *vmac;
  int d_1;
  int iVar38;
  long lVar39;
  ulong uVar40;
  int d;
  MultiFab *state;
  int iVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  BCRec *d_bc;
  uint scomp;
  DistributionMapping *dm;
  MultiFab *pMVar45;
  int i;
  int iVar46;
  long lVar47;
  bool bVar48;
  Real mult;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined8 in_stack_ffffffffffffeba8;
  undefined4 uVar51;
  undefined4 uVar52;
  Box gbx;
  long local_1398;
  Vector<int,_std::allocator<int>_> iconserv_h;
  int local_1368;
  int local_1364;
  int local_1360;
  Real local_1328;
  MFIter Smfi;
  long *local_1278 [2];
  long local_1268 [2];
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> local_1258;
  long *local_1238 [2];
  long local_1228 [2];
  undefined1 *local_1218;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_1210;
  long local_1208;
  long local_1200;
  long local_11f8;
  long local_11f0;
  long local_11e8;
  ulong local_11e0;
  FillPatchIterator S_fpi;
  FillPatchIterator rho_fpi;
  MultiFab momenta;
  MultiFab forcing_term;
  MultiFab visc_terms;
  MultiFab local_938 [6];
  
  pAVar4 = (this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
           super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
           super__Vector_impl_data._M_start[level];
  pGVar5 = (this->parent->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00._M_t.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (this->parent->amr_level).
       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[level]._M_t;
  bxs = &pAVar4->grids;
  lVar39 = 0;
  do {
    amrex::MultiFab::MultiFab
              ((MultiFab *)
               ((long)&local_938[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       _vptr_FabArrayBase + lVar39));
    lVar39 = lVar39 + 0x180;
  } while (lVar39 != 0x480);
  dm = &pAVar4->dmap;
  local_1218 = (undefined1 *)
               ((long)this_00._M_t.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x540);
  lVar39 = 0;
  do {
    amrex::MultiFab::MultiFab
              ((MultiFab *)
               ((long)&local_938[3].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       _vptr_FabArrayBase + lVar39));
    lVar39 = lVar39 + 0x180;
  } while (lVar39 != 0x480);
  geom = pGVar5 + level;
  pMVar21 = local_938 + 3;
  pMVar45 = local_938;
  lVar39 = 0;
  do {
    pBVar20 = amrex::AmrLevel::getEdgeBoxArray
                        ((this->LevelData).
                         super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                         super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[level],(int)lVar39);
    S_fpi.super_MFIter.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
    S_fpi.super_MFIter.tile_size.vect[2] = 0;
    S_fpi.super_MFIter.flags = '\0';
    S_fpi.super_MFIter._29_3_ = 0;
    S_fpi.super_MFIter.currentIndex = 0;
    S_fpi.super_MFIter.beginIndex = 0;
    S_fpi.super_MFIter.fabArray = (FabArrayBase *)0x0;
    S_fpi.super_MFIter.tile_size.vect[0] = 0;
    S_fpi.super_MFIter.tile_size.vect[1] = 0;
    (*(pMVar45->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
              (pMVar45,pBVar20,dm,(ulong)(uint)num_state_comps,0,&S_fpi,
               (int)(FabFactory<amrex::FArrayBox> *)
                    ((AmrLevel *)
                    ((long)this_00._M_t.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x218))->
                    _vptr_AmrLevel);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&S_fpi.super_MFIter.tile_size);
    S_fpi.super_MFIter.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
    S_fpi.super_MFIter.tile_size.vect[2] = 0;
    S_fpi.super_MFIter.flags = '\0';
    S_fpi.super_MFIter._29_3_ = 0;
    S_fpi.super_MFIter.currentIndex = 0;
    S_fpi.super_MFIter.beginIndex = 0;
    S_fpi.super_MFIter.fabArray = (FabArrayBase *)0x0;
    S_fpi.super_MFIter.tile_size.vect[0] = 0;
    S_fpi.super_MFIter.tile_size.vect[1] = 0;
    (*(pMVar21->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
              (pMVar21,pBVar20,dm,1,0,&S_fpi,
               (int)(FabFactory<amrex::FArrayBox> *)
                    ((AmrLevel *)
                    ((long)this_00._M_t.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x218))->
                    _vptr_AmrLevel);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&S_fpi.super_MFIter.tile_size);
    lVar39 = lVar39 + 1;
    pMVar21 = pMVar21 + 1;
    pMVar45 = pMVar45 + 1;
  } while (lVar39 != 3);
  iVar16 = NavierStokesBase::nghost_force
                     ((NavierStokesBase *)
                      this_00._M_t.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl);
  S_fpi.super_MFIter.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  S_fpi.super_MFIter.fabArray = (FabArrayBase *)0x0;
  S_fpi.super_MFIter.tile_size.vect[0] = 0;
  S_fpi.super_MFIter.tile_size.vect[1] = 0;
  S_fpi.super_MFIter.tile_size.vect[2] = 0;
  S_fpi.super_MFIter.flags = '\0';
  S_fpi.super_MFIter._29_3_ = 0;
  S_fpi.super_MFIter.currentIndex = 0;
  S_fpi.super_MFIter.beginIndex = 0;
  amrex::MultiFab::MultiFab
            (&visc_terms,bxs,dm,num_state_comps,iVar16,(MFInfo *)&S_fpi,
             (FabFactory<amrex::FArrayBox> *)
             ((AmrLevel *)
             ((long)this_00._M_t.
                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                    .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x218))->
             _vptr_AmrLevel);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&S_fpi.super_MFIter.tile_size);
  iVar16 = NavierStokesBase::nghost_state
                     ((NavierStokesBase *)
                      this_00._M_t.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl);
  amrex::FillPatchIterator::FillPatchIterator
            (&S_fpi,(AmrLevel *)
                    this_00._M_t.
                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                    .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&visc_terms,iVar16
             ,prev_time,0,0,num_state_comps);
  iVar16 = std::__cxx11::string::compare((char *)&NavierStokesBase::advection_scheme_abi_cxx11_);
  if (iVar16 == 0) {
    rho_fpi.super_MFIter.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
    rho_fpi.super_MFIter.fabArray = (FabArrayBase *)0x0;
    rho_fpi.super_MFIter.tile_size.vect[0] = 0;
    rho_fpi.super_MFIter.tile_size.vect[1] = 0;
    rho_fpi.super_MFIter.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )operator_new(0x18);
    rho_fpi.super_MFIter.fabArray =
         (FabArrayBase *)
         ((long)rho_fpi.super_MFIter.m_fa._M_t.
                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 0x18);
    *(undefined8 *)
     rho_fpi.super_MFIter.m_fa._M_t.
     super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
     super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
     super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl = 0xfffffd66fffffd66;
    *(undefined8 *)
     ((long)rho_fpi.super_MFIter.m_fa._M_t.
            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
            _M_t.
            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 8) =
         0xfffffd66fffffd66;
    *(undefined8 *)
     ((long)rho_fpi.super_MFIter.m_fa._M_t.
            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
            _M_t.
            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 0x10) =
         0xfffffd66fffffd66;
    rho_fpi.super_MFIter.tile_size.vect._0_8_ = rho_fpi.super_MFIter.fabArray;
    if (0 < num_state_comps) {
      pDVar24 = (DeviceVector<amrex::BCRec> *)
                ((long)this_00._M_t.
                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                       .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xbe0);
      scomp = 0;
      do {
        NavierStokesBase::fetchBCArray
                  ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&momenta,
                   (NavierStokesBase *)
                   this_00._M_t.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                   super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,0,scomp,1);
        uVar13 = rho_fpi.super_MFIter.tile_size.vect._0_8_;
        uVar15 = rho_fpi.super_MFIter.m_fa;
        rho_fpi.super_MFIter.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
             (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
              )(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
                )momenta.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase;
        rho_fpi.super_MFIter.fabArray =
             (FabArrayBase *)
             momenta.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_;
        rho_fpi.super_MFIter.tile_size.vect[0] =
             momenta.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_4_;
        rho_fpi.super_MFIter.tile_size.vect[1] =
             momenta.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._8_4_;
        momenta.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
             (_func_int **)0x0;
        momenta.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ = 0;
        momenta.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ = 0;
        if ((__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
            uVar15._M_t.
            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
            _M_t.
            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0) {
          operator_delete((void *)uVar15._M_t.
                                  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                  .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl,
                          uVar13 - (long)uVar15._M_t.
                                         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                         .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                         _M_head_impl);
        }
        if (momenta.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase !=
            (_func_int **)0x0) {
          operator_delete(momenta.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                          _vptr_FabArrayBase,
                          momenta.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat
                          .m_op._4_8_ -
                          (long)momenta.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                _vptr_FabArrayBase);
        }
        pDVar25 = pDVar24;
        pMVar21 = Ssync;
        aofs_comp = scomp - 3;
        if (scomp < 3) {
          pDVar25 = (DeviceVector<amrex::BCRec> *)
                    ((long)this_00._M_t.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xbc8);
          pMVar21 = Vsync;
          aofs_comp = scomp;
        }
        pBVar9 = pDVar25->m_data;
        bVar48 = amrex::EBFArrayBoxFactory::isAllRegular
                           ((EBFArrayBoxFactory *)
                            ((AmrLevel *)
                            ((long)this_00._M_t.
                                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                   .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                            0x218))->_vptr_AmrLevel);
        pMVar45 = Ucorr->_M_elems[0];
        if (bVar48) {
          MOL::ComputeSyncAofs
                    (pMVar21,aofs_comp,1,&S_fpi.m_fabs,scomp,u_mac,u_mac + 1,u_mac + 2,pMVar45,
                     Ucorr->_M_elems[1],Ucorr->_M_elems[2],local_938 + 3,local_938 + 4,local_938 + 5
                     ,0,false,local_938,local_938 + 1,local_938 + 2,scomp,
                     (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&rho_fpi,
                     pBVar9 + (int)aofs_comp,geom,scomp < 3);
        }
        else {
          pMVar10 = Ucorr->_M_elems[1];
          pMVar11 = Ucorr->_M_elems[2];
          local_1278[0] = local_1268;
          uVar49 = 0x293542;
          uVar50 = 0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1278,
                     NavierStokesBase::redistribution_type_abi_cxx11_._M_dataplus._M_p,
                     NavierStokesBase::redistribution_type_abi_cxx11_._M_dataplus._M_p +
                     NavierStokesBase::redistribution_type_abi_cxx11_._M_string_length);
          redistribution_type_00._M_string_length._0_4_ = uVar49;
          redistribution_type_00._M_dataplus._M_p = (pointer)local_1278;
          redistribution_type_00._M_string_length._4_4_ = uVar50;
          redistribution_type_00.field_2._M_allocated_capacity = in_stack_ffffffffffffeba8;
          redistribution_type_00.field_2._8_4_ = (int)pDVar24;
          redistribution_type_00.field_2._12_4_ = (int)((ulong)pDVar24 >> 0x20);
          EBMOL::ComputeSyncAofs
                    (pMVar21,aofs_comp,1,&S_fpi.m_fabs,scomp,u_mac,u_mac + 1,u_mac + 2,pMVar45,
                     pMVar10,pMVar11,local_938 + 3,local_938 + 4,local_938 + 5,0,false,local_938,
                     local_938 + 1,local_938 + 2,scomp,
                     (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&rho_fpi,
                     pBVar9 + (int)aofs_comp,geom,dt,scomp < 3,redistribution_type_00);
          if (local_1278[0] != local_1268) {
            operator_delete(local_1278[0],local_1268[0] + 1);
          }
        }
        scomp = scomp + 1;
      } while (num_state_comps != scomp);
    }
    if ((__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
        rho_fpi.super_MFIter.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0) {
      operator_delete((void *)rho_fpi.super_MFIter.m_fa._M_t.
                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl,
                      rho_fpi.super_MFIter.tile_size.vect._0_8_ -
                      (long)rho_fpi.super_MFIter.m_fa._M_t.
                            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl);
    }
  }
  else {
    iVar16 = std::__cxx11::string::compare((char *)&NavierStokesBase::advection_scheme_abi_cxx11_);
    if (((iVar16 == 0) ||
        (iVar16 = std::__cxx11::string::compare
                            ((char *)&NavierStokesBase::advection_scheme_abi_cxx11_), iVar16 == 0))
       || (iVar16 = std::__cxx11::string::compare
                              ((char *)&NavierStokesBase::advection_scheme_abi_cxx11_), iVar16 == 0)
       ) {
      iVar16 = NavierStokesBase::nghost_force
                         ((NavierStokesBase *)
                          this_00._M_t.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl);
      pMVar21 = NavierStokesBase::getDivCond
                          ((NavierStokesBase *)
                           this_00._M_t.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,iVar16,
                           prev_time);
      local_1210._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           ((pointer)
           ((AmrLevel *)
           ((long)this_00._M_t.
                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t
                  .super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x170))->
           _vptr_AmrLevel)[2].old_data._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&visc_terms.super_FabArray<amrex::FArrayBox>,0.0,0,
                 visc_terms.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,
                 &visc_terms.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow);
      if ((be_cn_theta != 1.0) || (NAN(be_cn_theta))) {
        (*(*(_func_int ***)
            this_00._M_t.
            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
            super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
            super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl)[0x33])
                  (SUB84(prev_time,0),
                   this_00._M_t.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                   super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&visc_terms,0,
                   (ulong)(uint)num_state_comps);
      }
      iVar16 = NavierStokesBase::nghost_state
                         ((NavierStokesBase *)
                          this_00._M_t.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl);
      amrex::FillPatchIterator::FillPatchIterator
                (&rho_fpi,(AmrLevel *)
                          this_00._M_t.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&visc_terms,
                 iVar16,prev_time,0,3,1);
      amrex::MultiFab::MultiFab(&momenta);
      if (do_mom_diff == 1) {
        forcing_term.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
             (_func_int **)0x1;
        forcing_term.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ = 0;
        forcing_term.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ =
             0;
        forcing_term.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._12_8_
             = 0;
        forcing_term.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._20_8_
             = 0;
        amrex::MultiFab::define
                  (&momenta,bxs,dm,3,
                   S_fpi.m_fabs.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[0],
                   (MFInfo *)&forcing_term,
                   (FabFactory<amrex::FArrayBox> *)
                   S_fpi.m_fabs.super_FabArray<amrex::FArrayBox>.m_factory._M_t.
                   super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                   .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl
                  );
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&forcing_term.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                      m_bat.m_op.m_bndryReg.m_typ);
        iVar16 = 0;
        amrex::MultiFab::Copy
                  (&momenta,&S_fpi.m_fabs,0,0,3,
                   S_fpi.m_fabs.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[0]);
        do {
          amrex::MultiFab::Multiply
                    (&momenta,&rho_fpi.m_fabs,0,iVar16,1,
                     S_fpi.m_fabs.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[0]
                    );
          iVar16 = iVar16 + 1;
        } while (iVar16 != 3);
      }
      iVar16 = NavierStokesBase::nghost_force
                         ((NavierStokesBase *)
                          this_00._M_t.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl);
      Smfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      Smfi.fabArray = (FabArrayBase *)0x0;
      Smfi.tile_size.vect[0] = 0;
      Smfi.tile_size.vect[1] = 0;
      Smfi.tile_size.vect[2] = 0;
      Smfi.flags = '\0';
      Smfi._29_3_ = 0;
      Smfi.currentIndex = 0;
      Smfi.beginIndex = 0;
      iconserv_h.super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)&PTR__FabFactory_0074e8d0;
      amrex::MultiFab::MultiFab
                (&forcing_term,bxs,dm,num_state_comps,iVar16,(MFInfo *)&Smfi,
                 (FabFactory<amrex::FArrayBox> *)&iconserv_h);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&Smfi.tile_size);
      amrex::MFIter::MFIter(&Smfi,(FabArrayBase *)&S_fpi.m_fabs,true);
      if (Smfi.currentIndex < Smfi.endIndex) {
        do {
          piVar26 = &Smfi.currentIndex;
          iVar16 = NavierStokesBase::nghost_force
                             ((NavierStokesBase *)
                              this_00._M_t.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl);
          amrex::MFIter::growntilebox(&gbx,&Smfi,iVar16);
          piVar33 = piVar26;
          if (Smfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar33 = ((Smfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + Smfi.currentIndex;
          }
          piVar27 = piVar26;
          if (Smfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar27 = ((Smfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + Smfi.currentIndex;
          }
          if (Smfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar26 = ((Smfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + Smfi.currentIndex;
          }
          (*(*(_func_int ***)
              this_00._M_t.
              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
              super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl)[0x2a])
                    (SUB84(prev_time,0),
                     this_00._M_t.
                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                     .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                     forcing_term.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                     super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[*piVar33],&gbx,0,
                     (ulong)(uint)num_state_comps,
                     S_fpi.m_fabs.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                     super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[*piVar27],
                     rho_fpi.m_fabs.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                     super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[*piVar26],0,(int)&Smfi);
          if (0 < num_state_comps) {
            local_1398 = 0;
            uVar40 = 0;
            do {
              piVar33 = &Smfi.currentIndex;
              amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        ((Array4<double> *)&iconserv_h,
                         &forcing_term.super_FabArray<amrex::FArrayBox>,&Smfi,(int)uVar40);
              local_11e0 = uVar40;
              if (uVar40 < 3) {
                piVar27 = piVar33;
                piVar26 = piVar33;
                if (Smfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
                  piVar26 = ((Smfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + Smfi.currentIndex;
                  piVar27 = ((Smfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + Smfi.currentIndex;
                }
                pFVar6 = visc_terms.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                         super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[*piVar26];
                iVar16 = (pFVar6->super_BaseFab<double>).domain.smallend.vect[0];
                iVar17 = (pFVar6->super_BaseFab<double>).domain.smallend.vect[1];
                iVar18 = (pFVar6->super_BaseFab<double>).domain.smallend.vect[2];
                pdVar7 = (pFVar6->super_BaseFab<double>).dptr;
                lVar34 = (long)(((pFVar6->super_BaseFab<double>).domain.bigend.vect[0] - iVar16) + 1
                               );
                lVar35 = (long)(((pFVar6->super_BaseFab<double>).domain.bigend.vect[1] - iVar17) + 1
                               );
                lVar36 = (long)(((pFVar6->super_BaseFab<double>).domain.bigend.vect[2] - iVar18) + 1
                               );
                lVar39 = *(long *)(*(long *)&(((FabArray<amrex::FArrayBox> *)
                                              local_1210._M_t.
                                              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                              .super__Head_base<0UL,_amrex::MultiFab_*,_false>.
                                              _M_head_impl)->m_fabs_v).
                                             super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                             ._M_impl + (long)*piVar27 * 8);
                iVar19 = *(int *)(lVar39 + 0x18);
                iVar1 = *(int *)(lVar39 + 0x1c);
                iVar2 = *(int *)(lVar39 + 0x20);
                lVar23 = *(long *)(lVar39 + 0x10);
                lVar28 = (long)((*(int *)(lVar39 + 0x24) - iVar19) + 1);
                lVar29 = (long)((*(int *)(lVar39 + 0x28) - iVar1) + 1);
                lVar39 = (long)((*(int *)(lVar39 + 0x2c) - iVar2) + 1);
                if (do_mom_diff == 0) {
                  if (Smfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
                    piVar33 = ((Smfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + Smfi.currentIndex;
                  }
                  if (gbx.smallend.vect[2] <= gbx.bigend.vect[2]) {
                    pFVar6 = rho_fpi.m_fabs.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                             super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[*piVar33];
                    iVar38 = (pFVar6->super_BaseFab<double>).domain.smallend.vect[0];
                    iVar3 = (pFVar6->super_BaseFab<double>).domain.smallend.vect[1];
                    lVar22 = (long)gbx.smallend.vect[0] * 8;
                    lVar30 = (long)gbx.smallend.vect[1] * 8;
                    local_11e8 = lVar30 + (long)iVar1 * -8;
                    pdVar8 = (pFVar6->super_BaseFab<double>).dptr;
                    iVar1 = (pFVar6->super_BaseFab<double>).domain.smallend.vect[2];
                    local_11f0 = (long)(((pFVar6->super_BaseFab<double>).domain.bigend.vect[0] -
                                        iVar38) + 1);
                    local_11f8 = (long)(((pFVar6->super_BaseFab<double>).domain.bigend.vect[1] -
                                        iVar3) + 1) * 8;
                    local_1200 = (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage * 8;
                    local_1208 = -(long)local_1360;
                    iVar46 = gbx.smallend.vect[2];
                    do {
                      if (gbx.smallend.vect[1] <= gbx.bigend.vect[1]) {
                        lVar32 = (long)iVar46;
                        lVar37 = (long)pdVar8 +
                                 ((lVar32 - iVar1) * local_11f8 + lVar30 + (long)iVar3 * -8) *
                                 local_11f0 + lVar22 + (long)iVar38 * -8;
                        lVar44 = (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start +
                                 (local_1208 + lVar32) * local_1200 +
                                 ((long)gbx.smallend.vect[1] - (long)local_1364) *
                                 (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish * 8 +
                                 (long)gbx.smallend.vect[0] * 8 + (long)local_1368 * -8;
                        lVar31 = ((lVar39 * local_1398 + (long)iVar2 * -8 + lVar32 * 8) * lVar29 +
                                 local_11e8) * lVar28 + lVar23 + lVar22 + (long)iVar19 * -8;
                        lVar32 = (long)pdVar7 +
                                 ((lVar36 * local_1398 + (long)iVar18 * -8 + lVar32 * 8) * lVar35 +
                                 lVar30 + (long)iVar17 * -8) * lVar34 + lVar22 + (long)iVar16 * -8;
                        iVar41 = gbx.smallend.vect[1];
                        do {
                          if (gbx.smallend.vect[0] <= gbx.bigend.vect[0]) {
                            lVar42 = 0;
                            do {
                              dVar12 = (*(double *)(lVar32 + lVar42 * 8) -
                                       *(double *)(lVar31 + lVar42 * 8)) +
                                       *(double *)(lVar44 + lVar42 * 8);
                              *(double *)(lVar44 + lVar42 * 8) = dVar12;
                              *(double *)(lVar44 + lVar42 * 8) =
                                   dVar12 / *(double *)(lVar37 + lVar42 * 8);
                              lVar42 = lVar42 + 1;
                            } while ((gbx.bigend.vect[0] - gbx.smallend.vect[0]) + 1 != (int)lVar42)
                            ;
                          }
                          iVar41 = iVar41 + 1;
                          lVar37 = lVar37 + local_11f0 * 8;
                          lVar44 = lVar44 + (long)iconserv_h.super_vector<int,_std::allocator<int>_>
                                                  .super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish * 8;
                          lVar31 = lVar31 + lVar28 * 8;
                          lVar32 = lVar32 + lVar34 * 8;
                        } while (gbx.bigend.vect[1] + 1 != iVar41);
                      }
                      bVar48 = iVar46 != gbx.bigend.vect[2];
                      iVar46 = iVar46 + 1;
                    } while (bVar48);
                  }
                }
                else if (gbx.smallend.vect[2] <= gbx.bigend.vect[2]) {
                  lVar22 = (long)gbx.smallend.vect[1];
                  lVar30 = (long)gbx.smallend.vect[0] * 8;
                  iVar38 = gbx.smallend.vect[2];
                  do {
                    if (gbx.smallend.vect[1] <= gbx.bigend.vect[1]) {
                      lVar31 = (long)iVar38;
                      lVar44 = (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                               (lVar31 - local_1360) *
                               (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage * 8 +
                               (lVar22 - local_1364) *
                               (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish * 8 +
                               (long)gbx.smallend.vect[0] * 8 + (long)local_1368 * -8;
                      lVar37 = ((lVar39 * local_1398 + (long)iVar2 * -8 + lVar31 * 8) * lVar29 +
                               lVar22 * 8 + (long)iVar1 * -8) * lVar28 +
                               lVar23 + lVar30 + (long)iVar19 * -8;
                      lVar32 = (long)pdVar7 +
                               ((lVar36 * local_1398 + (long)iVar18 * -8 + lVar31 * 8) * lVar35 +
                               lVar22 * 8 + (long)iVar17 * -8) * lVar34 + lVar30 + (long)iVar16 * -8
                      ;
                      lVar31 = lVar22;
                      do {
                        if (gbx.smallend.vect[0] <= gbx.bigend.vect[0]) {
                          lVar42 = 0;
                          do {
                            *(double *)(lVar44 + lVar42 * 8) =
                                 (*(double *)(lVar32 + lVar42 * 8) -
                                 *(double *)(lVar37 + lVar42 * 8)) +
                                 *(double *)(lVar44 + lVar42 * 8);
                            lVar42 = lVar42 + 1;
                          } while ((gbx.bigend.vect[0] - gbx.smallend.vect[0]) + 1 != (int)lVar42);
                        }
                        lVar31 = lVar31 + 1;
                        lVar44 = lVar44 + (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish * 8;
                        lVar37 = lVar37 + lVar28 * 8;
                        lVar32 = lVar32 + lVar34 * 8;
                      } while (gbx.bigend.vect[1] + 1 != (int)lVar31);
                    }
                    bVar48 = iVar38 != gbx.bigend.vect[2];
                    iVar38 = iVar38 + 1;
                  } while (bVar48);
                }
              }
              else {
                piVar26 = piVar33;
                if (Smfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
                  piVar26 = ((Smfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + Smfi.currentIndex;
                  piVar33 = ((Smfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + Smfi.currentIndex;
                }
                pFVar6 = visc_terms.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                         super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[*piVar26];
                iVar16 = (pFVar6->super_BaseFab<double>).domain.smallend.vect[0];
                lVar36 = (long)iVar16;
                iVar17 = (pFVar6->super_BaseFab<double>).domain.smallend.vect[1];
                lVar30 = (long)iVar17;
                iVar18 = (pFVar6->super_BaseFab<double>).domain.smallend.vect[2];
                lVar22 = (long)iVar18;
                pdVar7 = (pFVar6->super_BaseFab<double>).dptr;
                lVar39 = (long)(((pFVar6->super_BaseFab<double>).domain.bigend.vect[0] - iVar16) + 1
                               );
                lVar23 = (long)(((pFVar6->super_BaseFab<double>).domain.bigend.vect[1] - iVar17) + 1
                               );
                lVar35 = (long)(((pFVar6->super_BaseFab<double>).domain.bigend.vect[2] - iVar18) + 1
                               );
                pFVar6 = rho_fpi.m_fabs.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                         super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[*piVar33];
                pdVar8 = (pFVar6->super_BaseFab<double>).dptr;
                iVar16 = (pFVar6->super_BaseFab<double>).domain.smallend.vect[0];
                iVar17 = (pFVar6->super_BaseFab<double>).domain.smallend.vect[1];
                lVar29 = (long)(pFVar6->super_BaseFab<double>).domain.smallend.vect[2];
                lVar34 = (long)(((pFVar6->super_BaseFab<double>).domain.bigend.vect[0] - iVar16) + 1
                               );
                lVar28 = (long)(((pFVar6->super_BaseFab<double>).domain.bigend.vect[1] - iVar17) + 1
                               );
                if ((NavierStokesBase::do_temp == 0) || (uVar40 != (uint)NavierStokesBase::Temp)) {
                  if ((advectionType->super_vector<AdvectionForm,_std::allocator<AdvectionForm>_>).
                      super__Vector_base<AdvectionForm,_std::allocator<AdvectionForm>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar40] == Conservative) {
                    if (gbx.smallend.vect[2] <= gbx.bigend.vect[2]) {
                      lVar28 = (long)gbx.smallend.vect[1];
                      iVar16 = gbx.smallend.vect[2];
                      do {
                        if (gbx.smallend.vect[1] <= gbx.bigend.vect[1]) {
                          lVar31 = (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start +
                                   ((long)iVar16 - (long)local_1360) *
                                   (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_end_of_storage * 8 +
                                   (lVar28 - local_1364) *
                                   (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish * 8 +
                                   (long)gbx.smallend.vect[0] * 8 + (long)local_1368 * -8;
                          lVar34 = (long)pdVar7 +
                                   ((lVar35 * local_1398 + lVar22 * -8 + (long)iVar16 * 8) * lVar23
                                   + lVar28 * 8 + lVar30 * -8) * lVar39 +
                                   (long)gbx.smallend.vect[0] * 8 + lVar36 * -8;
                          lVar29 = lVar28;
                          do {
                            if (gbx.smallend.vect[0] <= gbx.bigend.vect[0]) {
                              lVar32 = 0;
                              do {
                                *(double *)(lVar31 + lVar32 * 8) =
                                     *(double *)(lVar34 + lVar32 * 8) +
                                     *(double *)(lVar31 + lVar32 * 8);
                                lVar32 = lVar32 + 1;
                              } while ((gbx.bigend.vect[0] - gbx.smallend.vect[0]) + 1 !=
                                       (int)lVar32);
                            }
                            lVar29 = lVar29 + 1;
                            lVar31 = lVar31 + (long)iconserv_h.
                                                    super_vector<int,_std::allocator<int>_>.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_finish * 8;
                            lVar34 = lVar34 + lVar39 * 8;
                          } while (gbx.bigend.vect[1] + 1 != (int)lVar29);
                        }
                        bVar48 = iVar16 != gbx.bigend.vect[2];
                        iVar16 = iVar16 + 1;
                      } while (bVar48);
                    }
                  }
                  else if (gbx.smallend.vect[2] <= gbx.bigend.vect[2]) {
                    lVar32 = (long)gbx.smallend.vect[1];
                    lVar31 = (long)gbx.smallend.vect[0] * 8;
                    iVar18 = gbx.smallend.vect[2];
                    do {
                      if (gbx.smallend.vect[1] <= gbx.bigend.vect[1]) {
                        lVar37 = (long)iVar18;
                        lVar42 = (long)pdVar7 +
                                 ((lVar35 * local_1398 + lVar22 * -8 + lVar37 * 8) * lVar23 +
                                 lVar32 * 8 + lVar30 * -8) * lVar39 + lVar31 + lVar36 * -8;
                        lVar47 = (long)pdVar8 +
                                 ((lVar37 - lVar29) * lVar28 * 8 + lVar32 * 8 + (long)iVar17 * -8) *
                                 lVar34 + lVar31 + (long)iVar16 * -8;
                        lVar44 = (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start +
                                 (lVar37 - local_1360) *
                                 (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage * 8 +
                                 (lVar32 - local_1364) *
                                 (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish * 8 +
                                 (long)gbx.smallend.vect[0] * 8 + (long)local_1368 * -8;
                        lVar37 = lVar32;
                        do {
                          if (gbx.smallend.vect[0] <= gbx.bigend.vect[0]) {
                            lVar43 = 0;
                            do {
                              *(double *)(lVar44 + lVar43 * 8) =
                                   *(double *)(lVar44 + lVar43 * 8) /
                                   *(double *)(lVar47 + lVar43 * 8) +
                                   *(double *)(lVar42 + lVar43 * 8);
                              lVar43 = lVar43 + 1;
                            } while ((gbx.bigend.vect[0] - gbx.smallend.vect[0]) + 1 != (int)lVar43)
                            ;
                          }
                          lVar37 = lVar37 + 1;
                          lVar42 = lVar42 + lVar39 * 8;
                          lVar47 = lVar47 + lVar34 * 8;
                          lVar44 = lVar44 + (long)iconserv_h.super_vector<int,_std::allocator<int>_>
                                                  .super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish * 8;
                        } while (gbx.bigend.vect[1] + 1 != (int)lVar37);
                      }
                      bVar48 = iVar18 != gbx.bigend.vect[2];
                      iVar18 = iVar18 + 1;
                    } while (bVar48);
                  }
                }
                else if (gbx.smallend.vect[2] <= gbx.bigend.vect[2]) {
                  lVar32 = (long)gbx.smallend.vect[1];
                  lVar31 = (long)gbx.smallend.vect[0] * 8;
                  iVar18 = gbx.smallend.vect[2];
                  do {
                    if (gbx.smallend.vect[1] <= gbx.bigend.vect[1]) {
                      lVar37 = (long)iVar18;
                      lVar44 = (long)pdVar8 +
                               ((lVar37 - lVar29) * lVar28 * 8 + lVar32 * 8 + (long)iVar17 * -8) *
                               lVar34 + lVar31 + (long)iVar16 * -8;
                      lVar47 = (long)pdVar7 +
                               ((lVar35 * local_1398 + lVar22 * -8 + lVar37 * 8) * lVar23 +
                               lVar32 * 8 + lVar30 * -8) * lVar39 + lVar31 + lVar36 * -8;
                      lVar42 = (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                               (lVar37 - local_1360) *
                               (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage * 8 +
                               (lVar32 - local_1364) *
                               (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish * 8 +
                               (long)gbx.smallend.vect[0] * 8 + (long)local_1368 * -8;
                      lVar37 = lVar32;
                      do {
                        if (gbx.smallend.vect[0] <= gbx.bigend.vect[0]) {
                          lVar43 = 0;
                          do {
                            *(double *)(lVar42 + lVar43 * 8) =
                                 (*(double *)(lVar42 + lVar43 * 8) +
                                 *(double *)(lVar47 + lVar43 * 8)) /
                                 *(double *)(lVar44 + lVar43 * 8);
                            lVar43 = lVar43 + 1;
                          } while ((gbx.bigend.vect[0] - gbx.smallend.vect[0]) + 1 != (int)lVar43);
                        }
                        lVar37 = lVar37 + 1;
                        lVar44 = lVar44 + lVar34 * 8;
                        lVar47 = lVar47 + lVar39 * 8;
                        lVar42 = lVar42 + (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish * 8;
                      } while (gbx.bigend.vect[1] + 1 != (int)lVar37);
                    }
                    bVar48 = iVar18 != gbx.bigend.vect[2];
                    iVar18 = iVar18 + 1;
                  } while (bVar48);
                }
              }
              uVar40 = uVar40 + 1;
              local_1398 = local_1398 + 8;
            } while (uVar40 != (uint)num_state_comps);
          }
          amrex::MFIter::operator++(&Smfi);
        } while (Smfi.currentIndex < Smfi.endIndex);
      }
      amrex::MFIter::~MFIter(&Smfi);
      if (0 < num_state_comps) {
        pMVar45 = local_938 + 2;
        yfluxes = local_938 + 1;
        pMVar10 = local_938 + 5;
        pMVar11 = local_938 + 4;
        wmac = u_mac + 2;
        vmac = u_mac + 1;
        uVar40 = 0;
        do {
          iVar16 = (int)uVar40;
          iVar17 = iVar16 + -3;
          pDVar24 = (DeviceVector<amrex::BCRec> *)
                    ((long)this_00._M_t.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xbe0);
          aofs = Ssync;
          if (uVar40 < 3) {
            pDVar24 = (DeviceVector<amrex::BCRec> *)
                      ((long)this_00._M_t.
                             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                             .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xbc8);
            iVar17 = iVar16;
            aofs = Vsync;
          }
          state = &S_fpi.m_fabs;
          if (uVar40 < 3) {
            state = &momenta;
          }
          d_bc = pDVar24->m_data + iVar17;
          if (do_mom_diff != 1) {
            state = &S_fpi.m_fabs;
          }
          Smfi.tile_size.vect[0] = 0;
          Smfi.tile_size.vect[1] = 0;
          Smfi.m_fa._M_t.
          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t
          .super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
                )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
                 0x0;
          Smfi.fabArray = (FabArrayBase *)0x0;
          iconserv_h.super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          iconserv_h.super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
               (pointer)0x0;
          iconserv_h.super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
               (pointer)0x0;
          amrex::PODVector<int,_std::allocator<int>_>::resize
                    ((PODVector<int,_std::allocator<int>_> *)&Smfi,1);
          gbx.smallend.vect._0_8_ = gbx.smallend.vect._0_8_ & 0xffffffff00000000;
          std::vector<int,_std::allocator<int>_>::resize
                    (&iconserv_h.super_vector<int,_std::allocator<int>_>,1,
                     (value_type_conflict *)&gbx);
          *iconserv_h.super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
               (uint)((advectionType->super_vector<AdvectionForm,_std::allocator<AdvectionForm>_>).
                      super__Vector_base<AdvectionForm,_std::allocator<AdvectionForm>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar40] == Conservative);
          if ((long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish -
              (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start != 0) {
            memcpy((void *)Smfi.m_fa._M_t.
                           super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                           .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl,
                   iconserv_h.super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start,(long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          iVar18 = std::__cxx11::string::compare
                             ((char *)&NavierStokesBase::advection_scheme_abi_cxx11_);
          bVar48 = amrex::EBFArrayBoxFactory::isAllRegular
                             ((EBFArrayBoxFactory *)
                              ((AmrLevel *)
                              ((long)this_00._M_t.
                                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                     .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                              0x218))->_vptr_AmrLevel);
          if (bVar48) {
            iVar19 = std::__cxx11::string::compare
                               ((char *)&NavierStokesBase::advection_scheme_abi_cxx11_);
            if ((uVar40 < 3) || (iVar19 != 0)) {
              Godunov::ComputeSyncAofs
                        (aofs,iVar17,1,state,iVar16,u_mac,vmac,wmac,Ucorr->_M_elems[0],
                         Ucorr->_M_elems[1],Ucorr->_M_elems[2],local_938 + 3,pMVar11,pMVar10,0,false
                         ,local_938,yfluxes,pMVar45,iVar16,&forcing_term,iVar16,pMVar21,d_bc,geom,
                         (DeviceVector<int> *)&Smfi,dt,iVar18 == 0,
                         NavierStokesBase::godunov_use_forces_in_trans,uVar40 < 3);
            }
            else {
              BDS::ComputeSyncAofs
                        (aofs,iVar17,1,state,iVar16,u_mac,vmac,wmac,Ucorr->_M_elems[0],
                         Ucorr->_M_elems[1],Ucorr->_M_elems[2],local_938 + 3,pMVar11,pMVar10,0,false
                         ,local_938,yfluxes,pMVar45,iVar16,&forcing_term,iVar16,pMVar21,d_bc,geom,
                         (DeviceVector<int> *)&Smfi,dt,false);
            }
          }
          else {
            gbx.smallend.vect[0] = 0;
            gbx.smallend.vect[1] = 0;
            gbx.smallend.vect[2] = 0;
            gbx.bigend.vect[0] = 0;
            gbx.bigend.vect[1] = 0;
            gbx.bigend.vect[2] = 0;
            gbx.smallend.vect._0_8_ = operator_new(0x18);
            gbx._8_8_ = gbx.smallend.vect._0_8_ + 0x18;
            *(undefined8 *)gbx.smallend.vect._0_8_ = 0xfffffd66fffffd66;
            *(undefined8 *)(gbx.smallend.vect._0_8_ + 8) = 0xfffffd66fffffd66;
            *(undefined8 *)(gbx.smallend.vect._0_8_ + 0x10) = 0xfffffd66fffffd66;
            gbx.bigend.vect._4_8_ = gbx._8_8_;
            NavierStokesBase::fetchBCArray
                      (&local_1258,
                       (NavierStokesBase *)
                       this_00._M_t.
                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                       .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,0,iVar16,1);
            uVar14 = gbx.bigend.vect._4_8_;
            uVar13 = gbx.smallend.vect._0_8_;
            gbx.smallend.vect._0_8_ =
                 local_1258.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                 super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                 super__Vector_impl_data._M_start;
            gbx._8_8_ = local_1258.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                        super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            gbx.bigend.vect._4_8_ =
                 local_1258.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                 super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_1258.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_1258.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1258.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (uVar13 != 0) {
              operator_delete((void *)uVar13,uVar14 - uVar13);
            }
            if (local_1258.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1258.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                              super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_1258.
                                    super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1258.
                                    super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            uVar51 = SUB84(Ucorr->_M_elems[0],0);
            uVar52 = (undefined4)((ulong)Ucorr->_M_elems[0] >> 0x20);
            vcorr = Ucorr->_M_elems[1];
            wcorr = Ucorr->_M_elems[2];
            local_1238[0] = local_1228;
            uVar49 = 0x292f6c;
            uVar50 = 0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1238,
                       NavierStokesBase::redistribution_type_abi_cxx11_._M_dataplus._M_p,
                       NavierStokesBase::redistribution_type_abi_cxx11_._M_dataplus._M_p +
                       NavierStokesBase::redistribution_type_abi_cxx11_._M_string_length);
            redistribution_type._M_string_length._0_4_ = uVar49;
            redistribution_type._M_dataplus._M_p = (pointer)local_1238;
            redistribution_type._M_string_length._4_4_ = uVar50;
            redistribution_type.field_2._M_allocated_capacity = in_stack_ffffffffffffeba8;
            redistribution_type.field_2._8_4_ = uVar51;
            redistribution_type.field_2._12_4_ = uVar52;
            EBGodunov::ComputeSyncAofs
                      (aofs,iVar17,1,state,iVar16,u_mac,vmac,wmac,
                       (MultiFab *)CONCAT44(uVar52,uVar51),vcorr,wcorr,local_938 + 3,pMVar11,pMVar10
                       ,0,false,local_938,yfluxes,pMVar45,iVar16,&forcing_term,iVar16,pMVar21,
                       (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&gbx,d_bc,geom,
                       (DeviceVector<int> *)&Smfi,dt,uVar40 < 3,redistribution_type);
            if (local_1238[0] != local_1228) {
              operator_delete(local_1238[0],local_1228[0] + 1);
            }
            if (gbx.smallend.vect._0_8_ != 0) {
              operator_delete((void *)gbx.smallend.vect._0_8_,
                              gbx.bigend.vect._4_8_ - gbx.smallend.vect._0_8_);
            }
          }
          if (iconserv_h.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              != (pointer)0x0) {
            operator_delete(iconserv_h.super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if ((__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
              Smfi.m_fa._M_t.
              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
              _M_t.
              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0)
          {
            operator_delete((void *)Smfi.m_fa._M_t.
                                    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                    .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                    _M_head_impl,Smfi.tile_size.vect._0_8_ << 2);
          }
          uVar40 = uVar40 + 1;
        } while ((uint)num_state_comps != uVar40);
      }
      amrex::MultiFab::~MultiFab(&forcing_term);
      amrex::MultiFab::~MultiFab(&momenta);
      amrex::FillPatchIterator::~FillPatchIterator(&rho_fpi);
      if (pMVar21 != (MultiFab *)0x0) {
        (*(pMVar21->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[1])();
      }
    }
    else {
      amrex::Abort_host("MacProj::mac_sync_compute: Unkown adveciton scheme");
    }
  }
  if (update_fluxreg && 0 < level) {
    mult = -1.0 / (double)(this->parent->n_cycle).super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[level];
    local_1328 = -dt;
    lVar39 = 0;
    do {
      if (0 < num_state_comps) {
        iVar16 = 0;
        do {
          amrex::FluxRegister::FineAdd
                    (adv_flux_reg,local_938 + lVar39,(int)lVar39,iVar16,iVar16,1,local_1328);
          iVar16 = iVar16 + 1;
        } while (num_state_comps != iVar16);
      }
      amrex::FluxRegister::FineAdd
                ((FluxRegister *)
                 (this->mac_reg).
                 super_vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[level]._M_t.
                 super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>
                 ,Ucorr->_M_elems[lVar39],(MultiFab *)(local_1218 + lVar39 * 0x180),(int)lVar39,0,0,
                 1,mult);
      lVar39 = lVar39 + 1;
    } while (lVar39 != 3);
  }
  amrex::FillPatchIterator::~FillPatchIterator(&S_fpi);
  amrex::MultiFab::~MultiFab(&visc_terms);
  lVar39 = 0x300;
  do {
    amrex::MultiFab::~MultiFab
              ((MultiFab *)
               ((long)&local_938[3].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       _vptr_FabArrayBase + lVar39));
    lVar39 = lVar39 + -0x180;
  } while (lVar39 != -0x180);
  lVar39 = 0x300;
  do {
    amrex::MultiFab::~MultiFab
              ((MultiFab *)
               ((long)&local_938[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       _vptr_FabArrayBase + lVar39));
    lVar39 = lVar39 + -0x180;
  } while (lVar39 != -0x180);
  return;
}

Assistant:

void
MacProj::mac_sync_compute (int                   level,
                           Array<MultiFab*,AMREX_SPACEDIM>& Ucorr,
                           MultiFab*             u_mac,
                           MultiFab&             Vsync,
                           MultiFab&             Ssync,
                           FluxRegister*         adv_flux_reg,
                           Vector<AdvectionForm>& advectionType,
                           Real                  prev_time,
                           Real                  dt,
                           int                   num_state_comps,
                           Real                  be_cn_theta,
                           int                   do_mom_diff,
                           bool                  update_fluxreg)
{
    //
    // Get parameters.
    //
    const BoxArray& grids               = LevelData[level]->boxArray();
    const DistributionMapping& dmap     = LevelData[level]->DistributionMap();
    const Geometry& geom                = parent->Geom(level);
    NavierStokesBase&   ns_level        = *(NavierStokesBase*) &(parent->getLevel(level));
    const MultiFab* area                = ns_level.Area();

    // Only two options: do all state components (including velocity) or just the
    // velocity components. Anything else will likely cause problems with the
    // mac register update.
    AMREX_ASSERT(num_state_comps == AMREX_SPACEDIM || num_state_comps == ns_level.NUM_STATE);

    const int  ncomp = 1;         // Number of components to process at once

    const int  nghost  = 0;

    //
    // Prep MFs to store fluxes and edge states
    //
    MultiFab fluxes[AMREX_SPACEDIM];
    MultiFab edgestate[AMREX_SPACEDIM];

    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        const BoxArray& ba = LevelData[level]->getEdgeBoxArray(i);
        fluxes[i].define(ba, dmap, num_state_comps, nghost, MFInfo(),ns_level.Factory());
        edgestate[i].define(ba, dmap, ncomp, nghost, MFInfo(), ns_level.Factory());
    }

    // Visc terms, is not used for MOL but we define it here anyways as base for the following
    // FillPatch operator
    MultiFab visc_terms(grids,dmap,num_state_comps,ns_level.nghost_force(),
                        MFInfo(),ns_level.Factory());
    FillPatchIterator S_fpi(ns_level,visc_terms,ns_level.nghost_state(),
                            prev_time,State_Type,0,num_state_comps);
    MultiFab& Smf = S_fpi.get_mf();

    //
    // Compute the mac sync correction.
    //
    if (ns_level.advection_scheme == "MOL")
    {
        Vector<BCRec>  math_bcs(ncomp);

        for (int comp = 0; comp < num_state_comps; ++comp)
        {
            // Get BCs for this component
            math_bcs = ns_level.fetchBCArray(State_Type, comp, ncomp);

            // Select sync MF and its component for processing
            const int  sync_comp = comp < AMREX_SPACEDIM ? comp   : comp-AMREX_SPACEDIM;
            MultiFab*  sync_ptr  = comp < AMREX_SPACEDIM ? &Vsync : &Ssync;
            bool    is_velocity  = comp < AMREX_SPACEDIM ? true   : false;

            BCRec  const* d_bcrec_ptr = comp < AMREX_SPACEDIM
                                               ? ns_level.get_bcrec_velocity_d_ptr()
                                               : ns_level.get_bcrec_scalars_d_ptr();

#ifdef AMREX_USE_EB
            if ( !(ns_level.EBFactory().isAllRegular()) )
            {
                EBMOL::ComputeSyncAofs(*sync_ptr, sync_comp, ncomp, Smf, comp,
                                       D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                       D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                       D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                                       D_DECL(fluxes[0],fluxes[1],fluxes[2]), comp,
                                       math_bcs, &d_bcrec_ptr[sync_comp], geom, dt,
                                       is_velocity, ns_level.redistribution_type );
            }
            else
#endif
            {
                MOL::ComputeSyncAofs(*sync_ptr, sync_comp, ncomp, Smf, comp,
                                     D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                     D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                     D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                                     D_DECL(fluxes[0],fluxes[1],fluxes[2]), comp,
                                     math_bcs, &d_bcrec_ptr[sync_comp], geom, is_velocity );
            }
        }
    }
    else if ( ns_level.advection_scheme == "Godunov_PLM" ||
              ns_level.advection_scheme == "Godunov_PPM" ||
              ns_level.advection_scheme == "BDS" )
    {
        std::unique_ptr<MultiFab> divu_fp (ns_level.getDivCond(ns_level.nghost_force(),prev_time));

        MultiFab& Gp = ns_level.get_old_data(Gradp_Type);

        visc_terms.setVal(0.0); // Initialize to make calls below safe

        // Get viscous forcing.
        if (be_cn_theta != 1.0)
        {
            ns_level.getViscTerms(visc_terms,0,num_state_comps,prev_time);
        }

        // Get density -- this isn't really needed if doing all of the state components...
        FillPatchIterator rho_fpi(ns_level,visc_terms,ns_level.nghost_state(),
                                  prev_time,State_Type,Density,1);
        MultiFab& rhoMF = rho_fpi.get_mf();

        // FIXME? - not sure we really need this momenta MF; could probably do with a
        // temporary FAB in the sync loop...
        //
        // Store momenta multifab if conservative approach is used,
        // i.e. rho* u.
        // We make it with AMREX_SPACEDIM components instead of only one
        // (loop below is done component by component) because ComputeSyncAofs will
        // need to know which component of velocity is being processed.
        MultiFab momenta;
        if  (do_mom_diff == 1)
        {
            momenta.define(grids,dmap, AMREX_SPACEDIM, Smf.nGrow(), MFInfo(), Smf.Factory());
            MultiFab::Copy(momenta,Smf,0,0,AMREX_SPACEDIM, Smf.nGrow());
            for (int d=0; d < AMREX_SPACEDIM; ++d )
                MultiFab::Multiply( momenta, rhoMF, 0, d, 1, Smf.nGrow());
        }


        //
        // Compute forcing terms
        //
        MultiFab forcing_term(grids, dmap, num_state_comps, ns_level.nghost_force());

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter Smfi(Smf,TilingIfNotGPU()); Smfi.isValid(); ++Smfi)
        {
            auto const gbx = Smfi.growntilebox(ns_level.nghost_force());

            //
            // Compute total forcing terms.
            //
            ns_level.getForce(forcing_term[Smfi],gbx,0,num_state_comps,
                              prev_time,Smf[Smfi],rhoMF[Smfi],0,Smfi);

            for (int comp = 0; comp < num_state_comps; ++comp)
            {
                auto const& tf    = forcing_term.array(Smfi,comp);

                if (comp < AMREX_SPACEDIM)  // Velocity/Momenta
                {
                    auto const& visc = visc_terms[Smfi].const_array(comp);
                    auto const& gp   = Gp[Smfi].const_array(comp);

                    if ( do_mom_diff == 0 )
                    {
                        auto const& rho   = rhoMF[Smfi].const_array();

                        amrex::ParallelFor(gbx, [tf, visc, gp, rho]
                        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                        {
                            tf(i,j,k)  += visc(i,j,k) - gp(i,j,k);
                            tf(i,j,k)  /= rho(i,j,k);
                        });
                    }
                    else
                    {
                        amrex::ParallelFor(gbx, [tf, visc, gp]
                        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                        {
                            tf(i,j,k)  += visc(i,j,k) - gp(i,j,k);
                        });
                    }

                }
                else  // Scalars. Reconstruct forcing terms as in scalar_advection
                {
                    auto const& visc = visc_terms[Smfi].const_array(comp);
                    auto const& rho = rhoMF[Smfi].const_array();

                    if ( NavierStokesBase::do_temp && comp==NavierStokesBase::Temp )
                    {
                        //
                        // Solving
                        //   dT/dt + U dot del T = ( del dot lambda grad T + H_T ) / (rho c_p)
                        // with tforces = H_T/c_p (since it's always density-weighted), and
                        // visc = del dot mu grad T, where mu = lambda/c_p
                        //
                        amrex::ParallelFor(gbx, [tf, visc, rho]
                        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                        { tf(i,j,k) = ( tf(i,j,k) + visc(i,j,k) ) / rho(i,j,k); });
                    }
                    else
                    {
                        if (advectionType[comp] == Conservative)
                        {
                            //
                            // For tracers, Solving
                            //   dS/dt + del dot (U S) = del dot beta grad (S/rho) + rho H_q
                            // where S = rho q, q is a concentration
                            // tforces = rho H_q (since it's always density-weighted)
                            // visc = del dot beta grad (S/rho)
                            //
                            amrex::ParallelFor(gbx, [tf, visc]
                            AMREX_GPU_DEVICE (int i, int j, int k ) noexcept
                            { tf(i,j,k) += visc(i,j,k); });
                        }
                        else
                        {
                            //
                            // Solving
                            //   dS/dt + U dot del S = del dot beta grad S + H_q
                            // where S = q, q is a concentration
                            // tforces = rho H_q (since it's always density-weighted)
                            // visc = del dot beta grad S
                            //
                            amrex::ParallelFor(gbx, [tf, visc, rho]
                            AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                            { tf(i,j,k) = tf(i,j,k) / rho(i,j,k) + visc(i,j,k); });
                        }
                    }
                }
            }
        }

        //
        // Perform sync
        //
        for (int comp = 0; comp < num_state_comps; ++comp)
        {
            // Select sync MF and its component for processing
            const int  sync_comp   = comp < AMREX_SPACEDIM ? comp   : comp-AMREX_SPACEDIM;
            MultiFab*  sync_ptr    = comp < AMREX_SPACEDIM ? &Vsync : &Ssync;
            const bool is_velocity = comp < AMREX_SPACEDIM ? true   : false;
            BCRec  const* d_bcrec_ptr = comp < AMREX_SPACEDIM
                                               ? &(ns_level.get_bcrec_velocity_d_ptr())[sync_comp]
                                               : &(ns_level.get_bcrec_scalars_d_ptr())[sync_comp];

            const auto& Q = (do_mom_diff == 1 and comp < AMREX_SPACEDIM) ? momenta : Smf;

            amrex::Gpu::DeviceVector<int> iconserv;
            Vector<int> iconserv_h;
            iconserv.resize(ncomp);
            iconserv_h.resize(ncomp, 0);
            for (int icomp = 0; icomp < ncomp; icomp++) {
                iconserv_h[icomp] = (advectionType[comp+icomp] == Conservative) ? 1 : 0;
            }
            Gpu::copy(Gpu::hostToDevice, iconserv_h.begin(), iconserv_h.end(), iconserv.begin());
            bool godunov_use_ppm = ( ns_level.advection_scheme == "Godunov_PPM" ? true : false );

#ifdef AMREX_USE_EB
            if ( !(ns_level.EBFactory().isAllRegular()) )
            {
                // Get BCs for this component
                Vector<BCRec>  math_bcs(ncomp);
                math_bcs = ns_level.fetchBCArray(State_Type, comp, ncomp);

                EBGodunov::ComputeSyncAofs(*sync_ptr, sync_comp, ncomp,
                                           Q, comp,
                                           AMREX_D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                           AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                           AMREX_D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                                           AMREX_D_DECL(fluxes[0],fluxes[1],fluxes[2]), comp,
                                           forcing_term, comp, *divu_fp,
                                           math_bcs, d_bcrec_ptr,
                                           geom, iconserv, dt, is_velocity,
                                           ns_level.redistribution_type);
            }
            else
#endif
            if (ns_level.advection_scheme == "BDS" && (!is_velocity))
            {
                BDS::ComputeSyncAofs(*sync_ptr, sync_comp, ncomp,
                                     Q, comp,
                                     AMREX_D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                     AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                     AMREX_D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                                     AMREX_D_DECL(fluxes[0],fluxes[1],fluxes[2]), comp,
                                     forcing_term, comp, *divu_fp,
                                     d_bcrec_ptr, geom, iconserv, dt, is_velocity);
            }
            else
            {
                Godunov::ComputeSyncAofs(*sync_ptr, sync_comp, ncomp,
                                         Q, comp,
                                         AMREX_D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                         AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                         AMREX_D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                                         AMREX_D_DECL(fluxes[0],fluxes[1],fluxes[2]), comp,
                                         forcing_term, comp, *divu_fp,
                                         d_bcrec_ptr, geom, iconserv, dt,
                                         godunov_use_ppm, ns_level.GodunovUseForcesInTrans(),
                                         is_velocity );
            }
        }
    }
    else
    {
        Abort("MacProj::mac_sync_compute: Unkown adveciton scheme");
    }


    if (level > 0 && update_fluxreg)
    {
        const Real mlt =  -1.0/Real(parent->nCycle(level));
        for (int d = 0; d < AMREX_SPACEDIM; ++d)
        {
            for (int comp = 0; comp < num_state_comps; ++comp)
            {
                    adv_flux_reg->FineAdd(fluxes[d],d,comp,comp,1,-dt);
            }
            //
            // Include grad_phi(aka Ucorr) in the mac registers corresponding
            // to the next coarsest interface.
            //
            mac_reg[level]->FineAdd(*Ucorr[d],area[d],d,0,0,1,mlt);
        }
    }
}